

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O1

int __thiscall libwebvtt::LineReader::GetLine(LineReader *this,string *line_ptr)

{
  uint uVar1;
  int iVar2;
  uint unaff_EBP;
  bool bVar3;
  char c;
  char c_1;
  char local_2a;
  byte local_29;
  
  if (line_ptr == (string *)0x0) {
    unaff_EBP = 0xffffffff;
  }
  else {
    line_ptr->_M_string_length = 0;
    *(line_ptr->_M_dataplus)._M_p = '\0';
    do {
      uVar1 = (**(this->super_Reader)._vptr_Reader)(this,&local_29);
      iVar2 = 1;
      if (-1 < (int)uVar1) {
        if (uVar1 == 0) {
          if (local_29 == 10) {
            uVar1 = 0;
          }
          else if (local_29 == 0xd) {
            iVar2 = 2;
            uVar1 = unaff_EBP;
          }
          else {
            uVar1 = 0xffffffff;
            if ((local_29 < 0xfe) && (line_ptr->_M_string_length < 10000)) {
              std::__cxx11::string::push_back((char)line_ptr);
              iVar2 = 0;
              uVar1 = unaff_EBP;
            }
          }
        }
        else {
          uVar1 = (uint)(line_ptr->_M_string_length == 0);
        }
      }
      unaff_EBP = uVar1;
    } while (iVar2 == 0);
    if ((((iVar2 == 2) &&
         (unaff_EBP = (**(this->super_Reader)._vptr_Reader)(this,&local_2a), -1 < (int)unaff_EBP))
        && (uVar1 = 0, bVar3 = unaff_EBP == 0, unaff_EBP = uVar1, bVar3)) && (local_2a != '\n')) {
      (*(this->super_Reader)._vptr_Reader[3])(this,(ulong)(uint)(int)local_2a);
    }
  }
  return unaff_EBP;
}

Assistant:

int LineReader::GetLine(std::string* line_ptr) {
  if (line_ptr == NULL)
    return -1;

  std::string& ln = *line_ptr;
  ln.clear();

  // Consume characters from the stream, until we
  // reach end-of-line (or end-of-stream).

  // The WebVTT spec states that lines may be
  // terminated in any of these three ways:
  //  LF
  //  CR
  //  CR LF

  // We interrogate each character as we read it from the stream.
  // If we detect an end-of-line character, we consume the full
  // end-of-line indication, and we're done; otherwise, accumulate
  // the character and repeat.

  for (;;) {
    char c;
    const int e = GetChar(&c);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return (ln.empty()) ? 1 : 0;

    // We have a character, so we must first determine
    // whether we have reached end-of-line.

    if (c == kLF)
      return 0;  // handle the easy end-of-line case immediately

    if (c == kCR)
      break;  // handle the hard end-of-line case outside of loop

    if (c == '\xFE' || c == '\xFF')  // not UTF-8
      return -1;

    // To defend against pathological or malicious streams, we
    // cap the line length at some arbitrarily-large value:
    enum { kMaxLineLength = 10000 };  // arbitrary

    if (ln.length() >= kMaxLineLength)
      return -1;

    // We don't have an end-of-line character, so accumulate
    // the character in our line buffer.
    ln.push_back(c);
  }

  // We detected a CR.  We must interrogate the next character
  // in the stream, to determine whether we have a LF (which
  // would make it part of this same line).

  char c;
  const int e = GetChar(&c);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;

  // If next character in the stream is not a LF, return it
  // to the stream (because it's part of the next line).
  if (c != kLF)
    UngetChar(c);

  return 0;
}